

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.hpp
# Opt level: O3

int __thiscall Centaurus::ATNPath::compare(ATNPath *this,ATNPath *p)

{
  int iVar1;
  int iVar2;
  int iVar4;
  long lVar5;
  pointer ppVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  int iVar3;
  
  ppVar6 = (this->
           super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
           ).
           super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar4 = -1;
  iVar1 = (int)((ulong)((long)(this->
                              super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                              ).
                              super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar6) >> 4) *
          -0x55555555;
  iVar3 = (int)((ulong)((long)(p->
                              super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                              ).
                              super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(p->
                             super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                             ).
                             super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4);
  iVar2 = iVar3 * -0x55555555;
  bVar9 = iVar1 + iVar3 * 0x55555555 < 0;
  if (SBORROW4(iVar1,iVar2) == bVar9) {
    if (iVar1 == iVar2 || SBORROW4(iVar1,iVar2) != bVar9) {
      if (0 < iVar1) {
        lVar7 = 8;
        lVar8 = 0x28;
        lVar5 = 0;
        do {
          iVar1 = std::__cxx11::wstring::compare
                            ((wstring *)((long)&(ppVar6->first)._vptr_Identifier + lVar7));
          if (iVar1 != 0) {
            return iVar1;
          }
          ppVar6 = (this->
                   super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                   ).
                   super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          iVar1 = *(int *)((long)&(((p->
                                    super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                                    ).
                                    super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->first).
                                  _vptr_Identifier + lVar8);
          iVar2 = *(int *)((long)&(ppVar6->first)._vptr_Identifier + lVar8);
          if (iVar2 < iVar1) {
            return -1;
          }
          if (iVar1 < iVar2) goto LAB_001247c6;
          lVar5 = lVar5 + 1;
          lVar7 = lVar7 + 0x30;
          lVar8 = lVar8 + 0x30;
        } while (lVar5 < (int)((ulong)((long)(this->
                                             super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                                             ).
                                             super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)ppVar6) >> 4) * -0x55555555);
      }
      iVar4 = 0;
    }
    else {
LAB_001247c6:
      iVar4 = 1;
    }
  }
  return iVar4;
}

Assistant:

int compare(const ATNPath& p) const
    {
        if (depth() < p.depth())
        {
            return -1;
        }
        else if (depth() > p.depth())
        {
            return +1;
        }
        else
        {
            for (int i = 0; i < depth(); i++)
            {
                int id_cmp = (*this)[i].first.str().compare(p[i].first.str());

                if (id_cmp != 0) return id_cmp;

                if ((*this)[i].second < p[i].second)
                    return -1;
                else if ((*this)[i].second > p[i].second)
                    return +1;
            }
        }
        return 0;
    }